

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void __thiscall
ImGuiInputTextCallbackData::InsertChars
          (ImGuiInputTextCallbackData *this,int pos,char *new_text,char *new_text_end)

{
  uint uVar1;
  ImGuiID IVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  uVar1 = this->Flags;
  if (new_text_end == (char *)0x0) {
    sVar5 = strlen(new_text);
    iVar8 = (int)sVar5;
  }
  else {
    iVar8 = (int)new_text_end - (int)new_text;
  }
  pIVar3 = GImGui;
  iVar4 = this->BufTextLen;
  if (this->BufSize <= iVar4 + iVar8) {
    if ((uVar1 >> 0x12 & 1) == 0) {
      return;
    }
    IVar2 = (GImGui->InputTextState).ID;
    if ((IVar2 == 0) || (GImGui->ActiveId != IVar2)) {
      __assert_fail("edit_state->ID != 0 && g.ActiveId == edit_state->ID",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_widgets.cpp"
                    ,0xef7,
                    "void ImGuiInputTextCallbackData::InsertChars(int, const char *, const char *)")
      ;
    }
    if (this->Buf != (GImGui->InputTextState).TextA.Data) {
      __assert_fail("Buf == edit_state->TextA.Data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_widgets.cpp"
                    ,0xef8,
                    "void ImGuiInputTextCallbackData::InsertChars(int, const char *, const char *)")
      ;
    }
    iVar7 = 0x100;
    if (0x100 < iVar8) {
      iVar7 = iVar8;
    }
    if (iVar8 * 4 < iVar7) {
      iVar7 = iVar8 * 4;
    }
    iVar6 = 0x20;
    if (7 < iVar8) {
      iVar6 = iVar7;
    }
    iVar7 = iVar6 + iVar4 + 1;
    ImVector<char>::reserve(&(GImGui->InputTextState).TextA,iVar6 + iVar4 + 2);
    this->Buf = (pIVar3->InputTextState).TextA.Data;
    (pIVar3->InputTextState).BufCapacityA = iVar7;
    this->BufSize = iVar7;
    iVar4 = this->BufTextLen;
  }
  if (iVar4 - pos != 0) {
    memmove(this->Buf + pos + iVar8,this->Buf + pos,(long)(iVar4 - pos));
  }
  memcpy(this->Buf + pos,new_text,(long)iVar8);
  this->Buf[(long)iVar8 + (long)this->BufTextLen] = '\0';
  iVar4 = this->CursorPos;
  if (pos <= iVar4) {
    iVar4 = iVar4 + iVar8;
    this->CursorPos = iVar4;
  }
  this->SelectionEnd = iVar4;
  this->SelectionStart = iVar4;
  this->BufDirty = true;
  this->BufTextLen = this->BufTextLen + iVar8;
  return;
}

Assistant:

void ImGuiInputTextCallbackData::InsertChars(int pos, const char* new_text, const char* new_text_end)
{
    const bool is_resizable = (Flags & ImGuiInputTextFlags_CallbackResize) != 0;
    const int new_text_len = new_text_end ? (int)(new_text_end - new_text) : (int)strlen(new_text);
    if (new_text_len + BufTextLen >= BufSize)
    {
        if (!is_resizable)
            return;

        // Contrary to STB_TEXTEDIT_INSERTCHARS() this is working in the UTF8 buffer, hence the mildly similar code (until we remove the U16 buffer altogether!)
        ImGuiContext& g = *GImGui;
        ImGuiInputTextState* edit_state = &g.InputTextState;
        IM_ASSERT(edit_state->ID != 0 && g.ActiveId == edit_state->ID);
        IM_ASSERT(Buf == edit_state->TextA.Data);
        int new_buf_size = BufTextLen + ImClamp(new_text_len * 4, 32, ImMax(256, new_text_len)) + 1;
        edit_state->TextA.reserve(new_buf_size + 1);
        Buf = edit_state->TextA.Data;
        BufSize = edit_state->BufCapacityA = new_buf_size;
    }

    if (BufTextLen != pos)
        memmove(Buf + pos + new_text_len, Buf + pos, (size_t)(BufTextLen - pos));
    memcpy(Buf + pos, new_text, (size_t)new_text_len * sizeof(char));
    Buf[BufTextLen + new_text_len] = '\0';

    if (CursorPos >= pos)
        CursorPos += new_text_len;
    SelectionStart = SelectionEnd = CursorPos;
    BufDirty = true;
    BufTextLen += new_text_len;
}